

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qfiledialog.cpp
# Opt level: O1

int __thiscall
QFileDialog::accept(QFileDialog *this,int __fd,sockaddr *__addr,socklen_t *__addr_len)

{
  QFileDialogPrivate *this_00;
  QFileDialogLineEdit *pQVar1;
  Data *pDVar2;
  Data *pDVar3;
  char cVar4;
  bool bVar5;
  FileMode mode;
  int iVar6;
  uint *__addr_len_00;
  QArrayData *__addr_len_01;
  undefined1 __addr_len_02 [8];
  sockaddr *extraout_RDX;
  sockaddr *extraout_RDX_00;
  sockaddr *__addr_00;
  sockaddr *__addr_01;
  sockaddr *__addr_02;
  sockaddr *__addr_03;
  long lVar7;
  QArrayDataPointer<QString> *pQVar8;
  QFileDialogPrivate *pQVar9;
  QFileDialogPrivate *this_01;
  long in_FS_OFFSET;
  QStringView QVar10;
  QLatin1String QVar11;
  QFileInfo info_2;
  QFileInfo info;
  QFileInfo info_1;
  QArrayDataPointer<QString> local_d0;
  QString local_b8;
  undefined1 local_a0 [8];
  undefined1 local_98 [16];
  QArrayData *local_88;
  QString local_78;
  QArrayDataPointer<QString> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = *(QFileDialogPrivate **)&(this->super_QDialog).super_QWidget.field_0x8;
  if (((this_00->super_QDialogPrivate).nativeDialogInUse != false) ||
     ((this_00->qFileDialogUi).d == (Ui_QFileDialog *)0x0)) {
    local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
    local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
    selectedUrls((QList<QUrl> *)&local_58,this);
    if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
      pQVar8 = &local_58;
      QFileDialogPrivate::emitUrlsSelected(this_00,(QList<QUrl> *)pQVar8);
      iVar6 = (int)pQVar8;
      __addr_00 = extraout_RDX;
      if ((undefined1 *)local_58.size == (undefined1 *)0x1) {
        pQVar9 = (QFileDialogPrivate *)local_58.ptr;
        QFileDialogPrivate::emitUrlSelected(this_00,(QUrl *)local_58.ptr);
        iVar6 = (int)pQVar9;
        __addr_00 = extraout_RDX_00;
      }
      QDialog::accept(&this->super_QDialog,iVar6,__addr_00,__addr_len);
    }
    QArrayDataPointer<QUrl>::~QArrayDataPointer((QArrayDataPointer<QUrl> *)&local_58);
    goto LAB_004f0d08;
  }
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = (QString *)&DAT_aaaaaaaaaaaaaaaa;
  selectedFiles((QStringList *)&local_58,this);
  if ((undefined1 *)local_58.size == (undefined1 *)0x0) goto LAB_004f0cfb;
  local_78.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d.ptr = (char16_t *)&DAT_aaaaaaaaaaaaaaaa;
  QLineEdit::text(&local_78,&((this_00->qFileDialogUi).d)->fileNameEdit->super_QLineEdit);
  if (((undefined1 *)local_78.d.size == (undefined1 *)0x2) &&
     (QVar10.m_data = local_78.d.ptr, QVar10.m_size = 2, QVar11.m_data = "..", QVar11.m_size = 2,
     cVar4 = QtPrivate::equalStrings(QVar10,QVar11), cVar4 != '\0')) {
    QFileDialogPrivate::navigateToParent(this_00);
    pQVar1 = ((this_00->qFileDialogUi).d)->fileNameEdit;
    if (pQVar1 != (QFileDialogLineEdit *)0x0) {
      QObject::blockSignals(SUB81(pQVar1,0));
    }
    QLineEdit::selectAll(&((this_00->qFileDialogUi).d)->fileNameEdit->super_QLineEdit);
    if (pQVar1 != (QFileDialogLineEdit *)0x0) {
      QObject::blockSignals(SUB81(pQVar1,0));
    }
    goto switchD_004f077e_default;
  }
  mode = QFileDialogOptions::fileMode();
  __addr_len_00 = &switchD_004f077e::switchdataD_006f4228;
  switch(mode) {
  case AnyFile:
    local_98._0_8_ = *(undefined8 *)&((QDialogPrivate *)&(local_58.ptr)->d)->super_QWidgetPrivate;
    local_98._8_8_ =
         *(undefined8 *)&(((QDialogPrivate *)&(local_58.ptr)->d)->super_QWidgetPrivate).field_0x8;
    __addr_len_01 =
         *(QArrayData **)&(((QDialogPrivate *)&(local_58.ptr)->d)->super_QWidgetPrivate).field_0x10;
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_98._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_98._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_a0 = (undefined1  [8])&DAT_aaaaaaaaaaaaaaaa;
    local_88 = __addr_len_01;
    QFileInfo::QFileInfo((QFileInfo *)local_a0,(QString *)local_98);
    cVar4 = QFileInfo::isDir();
    if (cVar4 == '\0') {
      cVar4 = QFileInfo::exists();
      if (cVar4 == '\0') {
        QFileInfo::path();
        lVar7 = QFileDialogPrivate::maxNameLength(&local_b8);
        if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
          }
        }
        if (lVar7 < 0) {
          bVar5 = false;
        }
        else {
          QFileInfo::fileName();
          bVar5 = lVar7 < local_b8.d.size;
          if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
            LOCK();
            ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
                 ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1
            ;
            UNLOCK();
            if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
            }
          }
        }
        if (bVar5) goto LAB_004f0cab;
      }
      cVar4 = QFileInfo::exists();
      if (((cVar4 != '\0') &&
          (cVar4 = QFileDialogOptions::testOption
                             ((FileDialogOption)
                              *(undefined8 *)
                               (*(long *)&(this->super_QDialog).super_QWidget.field_0x8 + 0x3d0)),
          cVar4 == '\0')) && (iVar6 = QFileDialogOptions::acceptMode(), iVar6 != 0)) {
        QFileInfo::fileName();
        bVar5 = QFileDialogPrivate::itemAlreadyExists(this_00,(QString *)&local_d0);
        if (&(local_d0.d)->super_QArrayData != (QArrayData *)0x0) {
          LOCK();
          ((local_d0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
               ((local_d0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
          UNLOCK();
          if (((local_d0.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
            QArrayData::deallocate(&(local_d0.d)->super_QArrayData,2,0x10);
          }
        }
        if (!bVar5) goto LAB_004f0cab;
      }
      QList<QString>::QList<QString,void>((QList<QString> *)&local_d0,(QString *)local_98);
      pQVar8 = &local_d0;
      QFileDialogPrivate::emitFilesSelected(this_00,(QStringList *)&local_d0);
      iVar6 = (int)pQVar8;
      QArrayDataPointer<QString>::~QArrayDataPointer(&local_d0);
      QDialog::accept(&this->super_QDialog,iVar6,__addr_03,(socklen_t *)__addr_len_01);
    }
    else {
      QFileInfo::absoluteFilePath();
      setDirectory(this,&local_b8);
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
LAB_004f0cab:
    pQVar8 = (QArrayDataPointer<QString> *)local_a0;
    goto LAB_004f0cb0;
  case ExistingFile:
  case ExistingFiles:
    if ((undefined1 *)local_58.size != (undefined1 *)0x0) {
      lVar7 = local_58.size * 0x18;
      pQVar9 = (QFileDialogPrivate *)local_58.ptr;
      do {
        local_b8.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
        this_01 = pQVar9;
        QFileInfo::QFileInfo((QFileInfo *)&local_b8,(QString *)pQVar9);
        cVar4 = QFileInfo::exists();
        if (cVar4 == '\0') {
          QFileDialogPrivate::getEnvironmentVariable((QString *)local_98,this_01,(QString *)pQVar9);
          QFileInfo::QFileInfo((QFileInfo *)&local_d0,(QString *)local_98);
          pDVar3 = local_b8.d.d;
          __addr_len_00 = (uint *)local_d0.d;
          local_b8.d.d = (Data *)local_d0.d;
          local_d0.d = (Data *)pDVar3;
          QFileInfo::~QFileInfo((QFileInfo *)&local_d0);
          if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
            }
          }
        }
        cVar4 = QFileInfo::exists();
        if (cVar4 == '\0') {
          QFileInfo::fileName();
          QFileDialogPrivate::itemNotFound(this_00,(QString *)local_98,mode);
          if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
            }
          }
LAB_004f0bbc:
          QFileInfo::~QFileInfo((QFileInfo *)&local_b8);
          goto switchD_004f077e_default;
        }
        cVar4 = QFileInfo::isDir();
        if (cVar4 != '\0') {
          QFileInfo::absoluteFilePath();
          setDirectory(this,(QString *)local_98);
          if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
            LOCK();
            (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
                 (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
            UNLOCK();
            if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0)
            {
              QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
            }
          }
          QLineEdit::clear(&((this_00->qFileDialogUi).d)->fileNameEdit->super_QLineEdit);
          goto LAB_004f0bbc;
        }
        QFileInfo::~QFileInfo((QFileInfo *)&local_b8);
        pQVar9 = (QFileDialogPrivate *)
                 &(pQVar9->super_QDialogPrivate).super_QWidgetPrivate.field_0x18;
        lVar7 = lVar7 + -0x18;
      } while (lVar7 != 0);
    }
    pQVar8 = &local_58;
    QFileDialogPrivate::emitFilesSelected(this_00,(QStringList *)pQVar8);
    QDialog::accept(&this->super_QDialog,(int)pQVar8,__addr_01,__addr_len_00);
    break;
  case Directory:
    local_98._0_8_ = *(undefined8 *)&((QDialogPrivate *)&(local_58.ptr)->d)->super_QWidgetPrivate;
    local_98._8_8_ =
         *(undefined8 *)&(((QDialogPrivate *)&(local_58.ptr)->d)->super_QWidgetPrivate).field_0x8;
    __addr_len_02 =
         *(undefined1 (*) [8])
          &(((QDialogPrivate *)&(local_58.ptr)->d)->super_QWidgetPrivate).field_0x10;
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QArrayData *)local_98._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i =
           (((QArrayData *)local_98._0_8_)->ref_)._q_value.super___atomic_base<int>._M_i + 1;
      UNLOCK();
    }
    local_d0.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
    pQVar9 = (QFileDialogPrivate *)local_98;
    local_88 = (QArrayData *)__addr_len_02;
    QFileInfo::QFileInfo((QFileInfo *)&local_d0,(QString *)pQVar9);
    cVar4 = QFileInfo::exists();
    if (cVar4 == '\0') {
      QFileDialogPrivate::getEnvironmentVariable(&local_b8,pQVar9,(QString *)local_98);
      QFileInfo::QFileInfo((QFileInfo *)local_a0,(QString *)&local_b8);
      __addr_len_02 = local_a0;
      pDVar2 = local_d0.d;
      local_d0.d = (Data *)local_a0;
      local_a0 = (undefined1  [8])pDVar2;
      QFileInfo::~QFileInfo((QFileInfo *)local_a0);
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    cVar4 = QFileInfo::exists();
    if (cVar4 == '\0') {
      QFileInfo::fileName();
      QFileDialogPrivate::itemNotFound(this_00,&local_b8,Directory);
      if (&(local_b8.d.d)->super_QArrayData != (QArrayData *)0x0) {
        LOCK();
        ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             ((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
        UNLOCK();
        if (((local_b8.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
          QArrayData::deallocate(&(local_b8.d.d)->super_QArrayData,2,0x10);
        }
      }
    }
    else {
      cVar4 = QFileInfo::isDir();
      if (cVar4 != '\0') {
        pQVar8 = &local_58;
        QFileDialogPrivate::emitFilesSelected(this_00,(QStringList *)pQVar8);
        QDialog::accept(&this->super_QDialog,(int)pQVar8,__addr_02,(socklen_t *)__addr_len_02);
      }
    }
    pQVar8 = &local_d0;
LAB_004f0cb0:
    QFileInfo::~QFileInfo((QFileInfo *)pQVar8);
    if ((QArrayData *)local_98._0_8_ != (QArrayData *)0x0) {
      LOCK();
      (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i =
           (((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i + -1;
      UNLOCK();
      if ((((QBasicAtomicInt *)local_98._0_8_)->_q_value).super___atomic_base<int>._M_i == 0) {
        QArrayData::deallocate((QArrayData *)local_98._0_8_,2,0x10);
      }
    }
  }
switchD_004f077e_default:
  if (&(local_78.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_78.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_78.d.d)->super_QArrayData,2,0x10);
    }
  }
LAB_004f0cfb:
  QArrayDataPointer<QString>::~QArrayDataPointer(&local_58);
LAB_004f0d08:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return (int)*(long *)(in_FS_OFFSET + 0x28);
  }
  __stack_chk_fail();
}

Assistant:

void QFileDialog::accept()
{
    Q_D(QFileDialog);
    if (!d->usingWidgets()) {
        const QList<QUrl> urls = selectedUrls();
        if (urls.isEmpty())
            return;
        d->emitUrlsSelected(urls);
        if (urls.size() == 1)
            d->emitUrlSelected(urls.first());
        QDialog::accept();
        return;
    }

    const QStringList files = selectedFiles();
    if (files.isEmpty())
        return;
    QString lineEditText = d->lineEdit()->text();
    // "hidden feature" type .. and then enter, and it will move up a dir
    // special case for ".."
    if (lineEditText == ".."_L1) {
        d->navigateToParent();
        const QSignalBlocker blocker(d->qFileDialogUi->fileNameEdit);
        d->lineEdit()->selectAll();
        return;
    }

    const auto mode = fileMode();
    switch (mode) {
    case Directory: {
        QString fn = files.first();
        QFileInfo info(fn);
        if (!info.exists())
            info = QFileInfo(d->getEnvironmentVariable(fn));
        if (!info.exists()) {
            d->itemNotFound(info.fileName(), mode);
            return;
        }
        if (info.isDir()) {
            d->emitFilesSelected(files);
            QDialog::accept();
        }
        return;
    }

    case AnyFile: {
        QString fn = files.first();
        QFileInfo info(fn);
        if (info.isDir()) {
            setDirectory(info.absoluteFilePath());
            return;
        }

        if (!info.exists()) {
            const long maxNameLength = d->maxNameLength(info.path());
            if (maxNameLength >= 0 && info.fileName().size() > maxNameLength)
                return;
        }

        // check if we have to ask for permission to overwrite the file
        if (!info.exists() || testOption(DontConfirmOverwrite) || acceptMode() == AcceptOpen) {
            d->emitFilesSelected(QStringList(fn));
            QDialog::accept();
        } else {
            if (d->itemAlreadyExists(info.fileName())) {
                d->emitFilesSelected(QStringList(fn));
                QDialog::accept();
            }
        }
        return;
    }

    case ExistingFile:
    case ExistingFiles:
        for (const auto &file : files) {
            QFileInfo info(file);
            if (!info.exists())
                info = QFileInfo(d->getEnvironmentVariable(file));
            if (!info.exists()) {
                d->itemNotFound(info.fileName(), mode);
                return;
            }
            if (info.isDir()) {
                setDirectory(info.absoluteFilePath());
                d->lineEdit()->clear();
                return;
            }
        }
        d->emitFilesSelected(files);
        QDialog::accept();
        return;
    }
}